

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O0

void Abc_NtkFxuCollectInfo(Abc_Ntk_t *pNtk,Fxu_Data_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  int local_24;
  int i;
  Abc_Obj_t *pNode;
  Fxu_Data_t *p_local;
  Abc_Ntk_t *pNtk_local;
  
  p->pManSop = (Mem_Flex_t *)pNtk->pManFunc;
  pVVar2 = Vec_PtrAlloc(0);
  p->vSops = pVVar2;
  pVVar2 = Vec_PtrAlloc(0);
  p->vFanins = pVVar2;
  pVVar2 = Vec_PtrAlloc(0);
  p->vSopsNew = pVVar2;
  pVVar2 = Vec_PtrAlloc(0);
  p->vFaninsNew = pVVar2;
  pVVar2 = p->vSops;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_PtrFill(pVVar2,iVar1,(void *)0x0);
  pVVar2 = p->vFanins;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_PtrFill(pVVar2,iVar1,(void *)0x0);
  pVVar2 = p->vSopsNew;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_PtrFill(pVVar2,iVar1 + p->nNodesExt,(void *)0x0);
  pVVar2 = p->vFaninsNew;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_PtrFill(pVVar2,iVar1 + p->nNodesExt,(void *)0x0);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj = Abc_NtkObj(pNtk,local_24);
    if ((((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) &&
        (iVar1 = Abc_SopGetVarNum((char *)(pObj->field_5).pData), 1 < iVar1)) &&
       (iVar1 = Abc_SopGetCubeNum((char *)(pObj->field_5).pData), 0 < iVar1)) {
      *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)(p->vSops->pArray + local_24) = pObj->field_5;
      p->vFanins->pArray[local_24] = &pObj->vFanins;
    }
  }
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p->nNodesOld = iVar1;
  return;
}

Assistant:

void Abc_NtkFxuCollectInfo( Abc_Ntk_t * pNtk, Fxu_Data_t * p )
{
    Abc_Obj_t * pNode;
    int i;
    // add information to the manager
    p->pManSop    = (Mem_Flex_t *)pNtk->pManFunc;
    p->vSops      = Vec_PtrAlloc(0);
    p->vFanins    = Vec_PtrAlloc(0);
    p->vSopsNew   = Vec_PtrAlloc(0);
    p->vFaninsNew = Vec_PtrAlloc(0);
    Vec_PtrFill( p->vSops,      Abc_NtkObjNumMax(pNtk), NULL );
    Vec_PtrFill( p->vFanins,    Abc_NtkObjNumMax(pNtk), NULL );
    Vec_PtrFill( p->vSopsNew,   Abc_NtkObjNumMax(pNtk) + p->nNodesExt, NULL );
    Vec_PtrFill( p->vFaninsNew, Abc_NtkObjNumMax(pNtk) + p->nNodesExt, NULL );
    // add SOPs and fanin array
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_SopGetVarNum((char *)pNode->pData) < 2 )
            continue;
        if ( Abc_SopGetCubeNum((char *)pNode->pData) < 1 )
            continue;
        p->vSops->pArray[i]   = pNode->pData;
        p->vFanins->pArray[i] = &pNode->vFanins;
    }
    p->nNodesOld = Abc_NtkObjNumMax(pNtk);
}